

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_upper_bound.hpp
# Opt level: O0

int * burst::galloping_upper_bound<std::initializer_list<int>const&,int,std::less<void>>
                (initializer_list<int> *range,undefined8 value)

{
  int *piVar1;
  int *piVar2;
  int *value_local;
  initializer_list<int> *range_local;
  
  piVar1 = std::begin<int>(*range);
  piVar2 = std::end<int>(*range);
  piVar1 = galloping_upper_bound<int_const*,int,std::less<void>>(piVar1,piVar2,value);
  return piVar1;
}

Assistant:

auto galloping_upper_bound (RandomAccessRange && range, const Value & value, Compare compare)
    {
        using std::begin;
        using std::end;
        return
            galloping_upper_bound
            (
                begin(std::forward<RandomAccessRange>(range)),
                end(std::forward<RandomAccessRange>(range)),
                value,
                std::move(compare)
            );
    }